

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_ipp.hpp
# Opt level: O0

shared_ptr<std::mutex,_true> * __thiscall
duckdb::shared_ptr<std::mutex,_true>::operator=
          (shared_ptr<std::mutex,_true> *this,shared_ptr<std::mutex,_true> *other)

{
  shared_ptr<std::mutex,_true> *in_RDI;
  shared_ptr<std::mutex,_true> *in_stack_ffffffffffffffe0;
  
  shared_ptr(in_stack_ffffffffffffffe0,in_RDI);
  swap(in_stack_ffffffffffffffe0,in_RDI);
  ~shared_ptr((shared_ptr<std::mutex,_true> *)0xbeb560);
  return in_RDI;
}

Assistant:

shared_ptr<T> &operator=(shared_ptr &&other) noexcept {
		// Create a new shared_ptr using the move constructor, then swap out the ownership to *this
		shared_ptr(std::move(other)).swap(*this);
		return *this;
	}